

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fssimplewindow.cpp
# Opt level: O2

void FsOpenWindow(FsOpenWindowOption *opt)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Display *pDVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  time_t tVar12;
  time_t tVar13;
  uint uVar14;
  ulong uVar15;
  undefined4 uVar16;
  char *pcVar17;
  char *pcVar18;
  char cVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  size_t __size;
  int local_1f0;
  int local_1ec;
  GLfloat shininess [4];
  GLfloat spc [4];
  GLfloat amb [4];
  GLfloat dif [4];
  uint local_168;
  uint local_164;
  XWMHints wmHints;
  XSetWindowAttributes swa;
  
  uVar2 = opt->x0;
  uVar9 = (ulong)uVar2;
  uVar3 = opt->y0;
  uVar10 = (ulong)uVar3;
  iVar4 = opt->wid;
  iVar5 = opt->hei;
  bVar1 = opt->useDoubleBuffer;
  pcVar17 = opt->windowTitle;
  FsXCreateKeyMapping();
  for (lVar11 = 0; lVar11 != 0x194; lVar11 = lVar11 + 4) {
    *(undefined4 *)((long)fsKeyPress + lVar11) = 0;
  }
  pcVar18 = "Main Window";
  if (pcVar17 != (char *)0x0) {
    pcVar18 = pcVar17;
  }
  ysXDsp = (Display *)XOpenDisplay(0);
  if (ysXDsp == (Display *)0x0) {
    pcVar17 = "Cannot Open Display.\n";
    __size = 0x15;
    goto LAB_00110730;
  }
  puts("Opened display.");
  iVar7 = glXQueryExtension(ysXDsp,0,0);
  if (iVar7 == 0) {
    pcVar17 = "This system doesn\'t support OpenGL.\n";
    __size = 0x24;
    goto LAB_00110730;
  }
  puts("Acquired GLX extension.");
  uVar16 = *(undefined4 *)(ysXDsp + 0xe0);
  if (bVar1 == false) {
    ysXVis = (XVisualInfo *)glXChooseVisual(ysXDsp,uVar16,ysGlxCfgSingle);
    cVar19 = '\x01';
    if (ysXVis == (XVisualInfo *)0x0) {
      uVar16 = *(undefined4 *)(ysXDsp + 0xe0);
      ysXVis = (XVisualInfo *)0x0;
      goto LAB_001101bb;
    }
  }
  else {
LAB_001101bb:
    ysXVis = (XVisualInfo *)glXChooseVisual(ysXDsp,uVar16,ysGlxCfgDouble);
    cVar19 = bVar1;
  }
  puts("Chose visual.");
  if (ysXVis == (XVisualInfo *)0x0) {
    pcVar17 = "Double buffer not supported?\n";
    __size = 0x1d;
  }
  else {
    ysXCMap = XCreateColormap(ysXDsp,*(undefined8 *)
                                      (*(long *)(ysXDsp + 0xe8) + 0x10 + (long)ysXVis->screen * 0x80
                                      ),ysXVis->visual,0);
    puts("Created colormap.");
    ysGlRC = (GLXContext)glXCreateContext(ysXDsp,ysXVis,0,1);
    if (ysGlRC != (GLXContext)0x0) {
      puts("Created OpenGL context.");
      swa.colormap = ysXCMap;
      swa.border_pixel = 0;
      swa.event_mask = 0x2804f;
      ysXWnd = XCreateWindow(ysXDsp,*(undefined8 *)
                                     (*(long *)(ysXDsp + 0xe8) + 0x10 + (long)ysXVis->screen * 0x80)
                             ,uVar9,uVar10,iVar4,iVar5,1,ysXVis->depth,1,ysXVis->visual,0x2808,&swa)
      ;
      puts("Created Window.");
      ysXWid = iVar4;
      ysXHei = iVar5;
      ysXlupX = uVar2;
      ysXlupY = uVar3;
      XStoreName(ysXDsp,ysXWnd,pcVar18);
      XSetWMHints(ysXDsp,ysXWnd);
      XSetIconName(ysXDsp,ysXWnd,pcVar18);
      XMapWindow(ysXDsp,ysXWnd);
      pDVar6 = ysXDsp;
      tVar12 = time((time_t *)0x0);
      do {
        tVar13 = time((time_t *)0x0);
      } while (tVar13 == tVar12);
      local_1ec = uVar2 + 1;
      local_1f0 = uVar3 + 1;
      tVar12 = time((time_t *)0x0);
      uVar15 = uVar9;
      uVar21 = uVar10;
      while( true ) {
        tVar13 = time((time_t *)0x0);
        if (tVar12 < tVar13) break;
        iVar7 = (int)uVar15;
        iVar20 = (int)uVar21;
        if ((local_1ec != iVar7) || (local_1f0 != iVar20)) {
          XMoveWindow(pDVar6,ysXWnd,uVar15,uVar21);
          local_1f0 = iVar20;
          local_1ec = iVar7;
        }
        iVar8 = XCheckTypedWindowEvent(pDVar6,ysXWnd,0x16,dif);
        if (iVar8 == 1) {
          printf("%d %d %d %d\n",(ulong)local_168,(ulong)local_164,uVar9,uVar10);
          uVar14 = uVar2 - local_168;
          uVar22 = uVar3 - local_164;
          if (0xfffffffc < uVar22 - 2 && 0xfffffffc < uVar14 - 2) break;
          printf("dx %d dy %d\n",(ulong)uVar14,(ulong)uVar22);
          iVar8 = (int)uVar14 >> 0x1f;
          if (0 < (int)uVar14) {
            iVar8 = 1;
          }
          uVar15 = (ulong)(iVar8 + iVar7 + uVar14);
          if ((int)uVar22 < 1) {
            uVar14 = (iVar20 + uVar22) - (uint)(uVar3 != local_164);
          }
          else {
            uVar14 = iVar20 + uVar22 + 1;
          }
          uVar21 = (ulong)uVar14;
        }
      }
      ysXlupX = uVar2;
      ysXlupY = uVar3;
      puts("Zzz...");
      sleep(1);
      puts("Slept one second.");
      glXMakeCurrent(ysXDsp,ysXWnd,ysGlRC);
      glClearColor(0x3f800000,0x3f800000,0x3f800000,0);
      glClear(0x4100);
      glFlush();
      glEnable(0xb71);
      glDepthFunc(0x203);
      glShadeModel(0x1d01);
      dif[0] = 0.8;
      dif[1] = 0.8;
      dif[2] = 0.8;
      dif[3] = 1.0;
      amb[0] = 0.4;
      amb[1] = 0.4;
      amb[2] = 0.4;
      amb[3] = 1.0;
      spc._0_8_ = 0x3f6666663f666666;
      spc[2] = 0.9;
      spc[3] = 1.0;
      shininess[0] = 50.0;
      shininess[1] = 50.0;
      shininess[2] = 50.0;
      shininess[3] = 0.0;
      glEnable(0xb50);
      glEnable(0x4000);
      glLightfv(0x4000,0x1201,dif);
      glLightfv(0x4000,0x1202,spc);
      glMaterialfv(0x405,0x1601,shininess);
      glLightModelfv(0xb53,amb);
      glEnable(0xb57);
      glEnable(0xba1);
      if (cVar19 == '\0') {
        glDrawBuffer(0x404);
      }
      glClearColor(0x3f800000,0x3f800000,0x3f800000,0);
      glClearDepth(0);
      glDisable(0xb71);
      glViewport(0,0,iVar4,iVar5);
      glMatrixMode(0x1701);
      glLoadIdentity();
      glOrtho(0,(double)((float)iVar4 + -1.0),(double)((float)iVar5 + -1.0),0,0xbff0000000000000,
              0x3ff0000000000000);
      glMatrixMode(0x1700);
      glLoadIdentity();
      glShadeModel(0x1d00);
      glPointSize(0x3f800000);
      glClear(0x4100);
      glColor3ub(0,0,0);
      return;
    }
    pcVar17 = "Cannot create OpenGL context.\n";
    __size = 0x1e;
    ysGlRC = (GLXContext)0x0;
  }
LAB_00110730:
  fwrite(pcVar17,__size,1,_stderr);
  exit(1);
}

Assistant:

void FsOpenWindow(const FsOpenWindowOption &opt)
{
	int x0=opt.x0;
	int y0=opt.y0;
	int wid=opt.wid;
	int hei=opt.hei;
	int useDoubleBuffer=(int)opt.useDoubleBuffer;
	// int useMultiSampleBuffer=(int)opt.useMultiSampleBuffer;
	const char *title=(NULL!=opt.windowTitle ? opt.windowTitle : "Main Window");

	int n;
	char **m,*def;
	XSetWindowAttributes swa;
	Font font;

	int lupX,lupY,sizX,sizY;
	lupX=x0;
	lupY=y0;
	sizX=wid;
	sizY=hei;

	FsXCreateKeyMapping();
	for(n=0; n<FSKEY_NUM_KEYCODE; n++)
	{
		fsKeyPress[n]=0;
	}

	ysXDsp=XOpenDisplay(NULL);

	if(ysXDsp!=NULL)
	{
		printf("Opened display.\n");
		if(glXQueryExtension(ysXDsp,NULL,NULL)!=0)
		{
			printf("Acquired GLX extension.\n");

			int tryAlternativeSingleBuffer=0;
			if(useDoubleBuffer!=0)
			{
				ysXVis=glXChooseVisual(ysXDsp,DefaultScreen(ysXDsp),ysGlxCfgDouble);
			}
			else
			{
				ysXVis=glXChooseVisual(ysXDsp,DefaultScreen(ysXDsp),ysGlxCfgSingle);
				if(NULL==ysXVis)
				{
					ysXVis=glXChooseVisual(ysXDsp,DefaultScreen(ysXDsp),ysGlxCfgDouble);
					tryAlternativeSingleBuffer=1;
				}
			}

			printf("Chose visual.\n");

			if(ysXVis!=NULL)
			{
				ysXCMap=XCreateColormap(ysXDsp,RootWindow(ysXDsp,ysXVis->screen),ysXVis->visual,AllocNone);
				printf("Created colormap.\n");

				ysGlRC=glXCreateContext(ysXDsp,ysXVis,None,GL_TRUE);
				if(ysGlRC!=NULL)
				{
					printf("Created OpenGL context.\n");

					swa.colormap=ysXCMap;
					swa.border_pixel=0;
					swa.event_mask=ysXEventMask;

					// Memo: lupX and lupY given to XCreateWindow will be ignored.
					//       Window must be moved to the desired position by XMoveWindow after XMapWindow.
					ysXWnd=XCreateWindow(ysXDsp,RootWindow(ysXDsp,ysXVis->screen),
							  lupX,lupY,sizX,sizY,
					                  1,
							  ysXVis->depth,
					                  InputOutput,
							  ysXVis->visual,
					                  CWEventMask|CWBorderPixel|CWColormap,&swa);

					printf("Created Window.\n");

					ysXWid=sizX;
					ysXHei=sizY;
					ysXlupX=lupX;
					ysXlupY=lupY;

					XStoreName(ysXDsp,ysXWnd,title);


// Should I use XSetWMProperties? titlebar problem.
					XWMHints wmHints;
					wmHints.flags=0;
					wmHints.initial_state=NormalState;
					XSetWMHints(ysXDsp,ysXWnd,&wmHints);


					XSetIconName(ysXDsp,ysXWnd,title);
					XMapWindow(ysXDsp,ysXWnd);

					// Memo: XCreateWindow probably ignore lupX and lupY.  Window must be moved here.
					ForceMoveWindow(ysXDsp,ysXWnd,lupX,lupY);
					// ForceMoveWindow may have failed to place the window, but let's at least reset lupX and lupY.
					ysXlupX=lupX;
					ysXlupY=lupY;

					printf("Zzz...\n");
					sleep(1);
					printf("Slept one second.\n");

					/* printf("Wait Expose Event\n");
					XEvent ev;
					while(XCheckTypedEvent(ysXDsp,Expose,&ev)!=True)
					  {
					    printf("Waiting for create notify\n");
					    sleep(1);
					  }
					printf("Window=%d\n",ev.xexpose.window);
					printf("Window Created\n"); */

					glXMakeCurrent(ysXDsp,ysXWnd,ysGlRC);

					// These lines are needed, or window will not appear >>
				    glClearColor(1.0F,1.0F,1.0F,0.0F);
					glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT);
					glFlush();
					// glXSwapBuffers(ysXDsp,ysXWnd);
					// These lines are needed, or window will not appear <<

					glEnable(GL_DEPTH_TEST);
					glDepthFunc(GL_LEQUAL);
					glShadeModel(GL_SMOOTH);

					GLfloat dif[]={0.8F,0.8F,0.8F,1.0F};
					GLfloat amb[]={0.4F,0.4F,0.4F,1.0F};
					GLfloat spc[]={0.9F,0.9F,0.9F,1.0F};
					GLfloat shininess[]={50.0,50.0,50.0,0.0};

					glEnable(GL_LIGHTING);
					glEnable(GL_LIGHT0);
					glLightfv(GL_LIGHT0,GL_DIFFUSE,dif);
					glLightfv(GL_LIGHT0,GL_SPECULAR,spc);
					glMaterialfv(GL_FRONT|GL_BACK,GL_SHININESS,shininess);

					glLightModelfv(GL_LIGHT_MODEL_AMBIENT,amb);
					glEnable(GL_COLOR_MATERIAL);
					glEnable(GL_NORMALIZE);

					if(0!=tryAlternativeSingleBuffer)
					{
						glDrawBuffer(GL_FRONT);
					}

				    glClearColor(1.0F,1.0F,1.0F,0.0F);
				    glClearDepth(1.0F);
					glDisable(GL_DEPTH_TEST);

					glViewport(0,0,sizX,sizY);

				    glMatrixMode(GL_PROJECTION);
					glLoadIdentity();
					glOrtho(0,(float)sizX-1,(float)sizY-1,0,-1,1);

					glMatrixMode(GL_MODELVIEW);
					glLoadIdentity();

					glShadeModel(GL_FLAT);
					glPointSize(1);
					glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT);
					glColor3ub(0,0,0);
				}
				else
				{
					fprintf(stderr,"Cannot create OpenGL context.\n");
					exit(1);
				}
			}
			else
			{
				fprintf(stderr,"Double buffer not supported?\n");
				exit(1);
			}
		}
		else
		{
			fprintf(stderr,"This system doesn't support OpenGL.\n");
			exit(1);
		}
	}
	else
	{
		fprintf(stderr,"Cannot Open Display.\n");
		exit(1);
	}

	return;
}